

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O3

int x86Jcc(uchar *stream,uint labelID,x86Cond cond,bool isNear)

{
  UnsatisfiedJump *pUVar1;
  ulong uVar2;
  undefined7 in_register_00000009;
  int iVar3;
  ulong uVar4;
  UnsatisfiedJump local_18;
  
  if ((int)CONCAT71(in_register_00000009,isNear) == 0) {
    *stream = condCode[cond] + 'p';
    iVar3 = 2;
  }
  else {
    *stream = '\x0f';
    stream[1] = condCode[cond] + 0x80;
    iVar3 = 6;
  }
  local_18.labelID = labelID & 0x7fffffff;
  local_18.isNear = isNear;
  uVar4 = (ulong)pendingJumps.count;
  if (pendingJumps.count == pendingJumps.max) {
    local_18.jmpPos = stream;
    FastVector<UnsatisfiedJump,_false,_false>::grow_and_add
              (&pendingJumps,pendingJumps.count,&local_18);
  }
  else {
    pendingJumps.count = pendingJumps.count + 1;
    uVar2 = CONCAT44(local_18._4_4_,labelID) & 0xffffffff7fffffff;
    pUVar1 = pendingJumps.data + uVar4;
    pUVar1->labelID = (int)uVar2;
    pUVar1->isNear = (bool)(char)(uVar2 >> 0x20);
    *(int3 *)&pUVar1->field_0x5 = (int3)(uVar2 >> 0x28);
    pUVar1->jmpPos = stream;
  }
  return iVar3;
}

Assistant:

int x86Jcc(unsigned char *stream, unsigned int labelID, x86Cond cond, bool isNear)
{
	labelID &= 0x7FFFFFFF;

	if(isNear)
	{
		stream[0] = 0x0f;
		stream[1] = 0x80 + condCode[cond];
	}else{
		stream[0] = 0x70 + condCode[cond];
	}

	pendingJumps.push_back(UnsatisfiedJump(labelID, isNear, stream));
	return (isNear ? 6 : 2);
}